

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpStateVarComplete.c
# Opt level: O0

UpnpStateVarComplete * UpnpStateVarComplete_new(void)

{
  UpnpString *pUVar1;
  s_UpnpStateVarComplete *p;
  
  p = (s_UpnpStateVarComplete *)calloc(1,0x20);
  if (p == (s_UpnpStateVarComplete *)0x0) {
    p = (s_UpnpStateVarComplete *)0x0;
  }
  else {
    pUVar1 = UpnpString_new();
    p->m_CtrlUrl = pUVar1;
    pUVar1 = UpnpString_new();
    p->m_StateVarName = pUVar1;
  }
  return p;
}

Assistant:

UpnpStateVarComplete *UpnpStateVarComplete_new(void)
{
	struct s_UpnpStateVarComplete *p =
		calloc(1, sizeof(struct s_UpnpStateVarComplete));

	if (!p)
		return 0;

	/*p->m_ErrCode = 0;*/
	p->m_CtrlUrl = UpnpString_new();
	p->m_StateVarName = UpnpString_new();
	/*p->m_CurrentVal = 0;*/

	return (UpnpStateVarComplete *)p;
}